

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O1

void __thiscall LINAnalyzerSettings::LoadSettings(LINAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  SimpleArchive local_20 [8];
  
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mLINVersion);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void LINAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mLINVersion;

    ClearChannels();
    AddChannel( mInputChannel, "LIN", true );

    UpdateInterfacesFromSettings();
}